

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  char *pcVar2;
  ushort uVar3;
  short sVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  short *psVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  char cVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong *puVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long *plVar22;
  char *pcVar23;
  BYTE *e;
  short *psVar24;
  char *pcVar25;
  ulong *puVar26;
  short *psVar27;
  short *psVar28;
  int iVar29;
  ulong uVar30;
  int *piVar31;
  int local_4078;
  LZ4_stream_t ctxBody;
  
  iVar16 = 0;
  memset(&ctxBody,0,0x4020);
  ctxBody.internal_donotuse.currentOffset = *srcSizePtr;
  uVar10 = (ulong)ctxBody.internal_donotuse.currentOffset;
  if (uVar10 < 0x7e000001) {
    iVar16 = ctxBody.internal_donotuse.currentOffset +
             ctxBody.internal_donotuse.currentOffset / 0xff + 0x10;
  }
  if (iVar16 <= targetDstSize) {
    iVar16 = LZ4_compress_fast_extState
                       (&ctxBody,src,dst,ctxBody.internal_donotuse.currentOffset,targetDstSize,1);
    return iVar16;
  }
  iVar16 = (int)src;
  plVar12 = (long *)src;
  if ((int)ctxBody.internal_donotuse.currentOffset < 0x1000b) {
    if (0x7e000000 < ctxBody.internal_donotuse.currentOffset) {
      return 0;
    }
    if (ctxBody.internal_donotuse.currentOffset == 0) {
      if (targetDstSize < 1) {
        return 0;
      }
      *dst = '\0';
      *srcSizePtr = 0;
      return 1;
    }
    if (targetDstSize < 1) {
      return 0;
    }
    pcVar25 = dst + targetDstSize;
    ctxBody.internal_donotuse.tableType = 3;
    psVar27 = (short *)dst;
    if (0xc < ctxBody.internal_donotuse.currentOffset) {
      *(undefined2 *)((long)&ctxBody + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_00109ebd:
      uVar9 = 1;
      uVar30 = 0x40;
      iVar14 = *(int *)((long)plVar12 + 1);
      plVar11 = (long *)((long)plVar12 + 1);
      do {
        plVar22 = plVar11;
        plVar11 = (long *)(uVar9 + (long)plVar22);
        if (src + (uVar10 - 0xb) < plVar11) goto LAB_0010a6c1;
        uVar9 = uVar30 >> 6;
        uVar30 = (ulong)((int)uVar30 + 1);
        uVar19 = (ulong)((uint)(iVar14 * -0x61c8864f) >> 0x13);
        uVar21 = (ulong)*(ushort *)((long)&ctxBody + uVar19 * 2);
        sVar4 = (short)src;
        iVar14 = (int)*plVar11;
        *(short *)((long)&ctxBody + uVar19 * 2) = (short)plVar22 - sVar4;
      } while (*(int *)(src + uVar21) != (int)*plVar22);
      lVar15 = 0;
      cVar5 = (char)plVar22 * '\x10' + (char)plVar12 * -0x10;
      do {
        cVar13 = cVar5;
        lVar20 = lVar15;
        pcVar23 = src + lVar20 + uVar21;
        plVar11 = (long *)((long)plVar22 + lVar20);
        if ((pcVar23 <= src) || (plVar11 <= plVar12)) break;
        lVar15 = lVar20 + -1;
        cVar5 = cVar13 + -0x10;
      } while (*(char *)((long)plVar22 + lVar20 + -1) == src[lVar20 + (uVar21 - 1)]);
      iVar29 = (int)plVar22 - (int)plVar12;
      iVar14 = (int)lVar20;
      uVar9 = (ulong)(uint)(iVar29 + iVar14);
      uVar7 = iVar29 + iVar14;
      if ((char *)((long)psVar27 + uVar9 + (ulong)(uVar7 + 0xf0) / 0xff + 0xc) <= pcVar25) {
        if (uVar7 < 0xf) {
          psVar8 = (short *)((long)psVar27 + 1);
          *(char *)psVar27 = cVar13;
        }
        else {
          *(char *)psVar27 = -0x10;
          psVar8 = psVar27 + 1;
          for (iVar14 = ((int)plVar22 - (int)plVar12) + iVar14 + -0xf; 0xfe < iVar14;
              iVar14 = iVar14 + -0xff) {
            *(char *)((long)psVar8 + -1) = -1;
            psVar8 = (short *)((long)psVar8 + 1);
          }
          *(char *)((long)psVar8 + -1) = (char)iVar14;
        }
        psVar24 = (short *)(uVar9 + (long)psVar8);
        lVar15 = 0;
        do {
          pcVar2 = (char *)((long)psVar8 + lVar15);
          *(undefined8 *)pcVar2 = *(undefined8 *)((long)plVar12 + lVar15);
          lVar15 = lVar15 + 8;
          psVar28 = psVar27;
        } while (pcVar2 + 8 < psVar24);
        do {
          psVar27 = psVar28;
          if (pcVar25 < (char *)((long)psVar24 + 0xb)) break;
          *psVar24 = (short)plVar11 - (short)pcVar23;
          puVar1 = (ulong *)((long)plVar11 + 4);
          puVar17 = (ulong *)(pcVar23 + 4);
          puVar26 = puVar1;
          if (src + (uVar10 - 0xc) <= puVar1) {
LAB_0010a017:
            iVar14 = ((int)puVar26 - (int)plVar11) + -4;
LAB_0010a01f:
            if (puVar26 < src + (uVar10 - 0xc)) {
              if (*puVar17 == *puVar26) goto code_r0x0010a033;
              uVar30 = *puVar26 ^ *puVar17;
              uVar9 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar14);
            }
            else {
              if ((puVar26 < src + (uVar10 - 8)) && ((int)*puVar17 == (int)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar26 < src + (uVar10 - 6)) && ((short)*puVar17 == (short)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar26 < src + (uVar10 - 5)) {
                puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar17 == (char)*puVar26));
              }
              uVar9 = (ulong)(uint)((int)puVar26 - (int)puVar1);
            }
            goto LAB_0010a05b;
          }
          if (*puVar17 == *puVar1) {
            puVar17 = (ulong *)(pcVar23 + 0xc);
            puVar26 = (ulong *)((long)plVar11 + 0xc);
            goto LAB_0010a017;
          }
          uVar30 = *puVar1 ^ *puVar17;
          uVar9 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar9 = uVar9 >> 3 & 0x1fffffff;
LAB_0010a05b:
          psVar27 = psVar24 + 1;
          uVar6 = (uint)uVar9;
          plVar11 = (long *)((long)plVar11 + uVar9 + 4);
          uVar7 = uVar6;
          if (pcVar25 < (char *)((long)psVar24 + (ulong)(uVar6 + 0xf0) / 0xff + 8)) {
            uVar7 = ((int)pcVar25 - (int)psVar27) * 0xff - 0x5ec;
            plVar11 = (long *)((long)plVar11 - (ulong)(uVar6 - uVar7));
            plVar12 = plVar11;
            if (plVar11 <= plVar22) {
              for (; plVar12 <= plVar22; plVar12 = (long *)((long)plVar12 + 1)) {
                *(undefined2 *)
                 ((long)&ctxBody + (ulong)((uint)((int)*plVar12 * -0x61c8864f) >> 0x13) * 2) = 0;
              }
            }
          }
          if (uVar7 < 0xf) {
            *(char *)psVar28 = (char)*psVar28 + (char)uVar7;
          }
          else {
            *(char *)psVar28 = (char)*psVar28 + '\x0f';
            psVar27[0] = -1;
            psVar27[1] = -1;
            lVar15 = 0;
            for (uVar6 = uVar7 - 0xf; 0x3fb < uVar6; uVar6 = uVar6 - 0x3fc) {
              pcVar23 = (char *)((long)psVar24 + lVar15 + 6);
              pcVar23[0] = -1;
              pcVar23[1] = -1;
              pcVar23[2] = -1;
              pcVar23[3] = -1;
              lVar15 = lVar15 + 4;
            }
            lVar20 = lVar15 + (ulong)(uVar6 & 0xffff) / 0xff;
            psVar27 = (short *)((long)psVar24 + lVar20 + 3);
            *(char *)((long)psVar24 + lVar20 + 2) =
                 (char)((uVar6 & 0xffff) / 0xff) + (char)uVar7 + -0xf + (char)lVar15;
          }
          plVar12 = plVar11;
          if (src + (uVar10 - 0xb) <= plVar11) break;
          *(short *)((long)&ctxBody +
                    (ulong)((uint)(*(int *)((long)plVar11 + -2) * -0x61c8864f) >> 0x13) * 2) =
               ((short)plVar11 + -2) - sVar4;
          uVar9 = (ulong)((uint)((int)*plVar11 * -0x61c8864f) >> 0x13);
          uVar3 = *(ushort *)((long)&ctxBody + uVar9 * 2);
          pcVar23 = src + uVar3;
          *(short *)((long)&ctxBody + uVar9 * 2) = (short)plVar11 - sVar4;
          if (*(int *)(src + uVar3) != (int)*plVar11) goto LAB_00109ebd;
          psVar24 = (short *)((long)psVar27 + 1);
          *(char *)psVar27 = '\0';
          psVar28 = psVar27;
        } while( true );
      }
    }
LAB_0010a6c1:
    pcVar23 = src + (uVar10 - (long)plVar12);
    if (pcVar25 < (char *)((long)psVar27 + (long)(pcVar23 + (ulong)(pcVar23 + 0xf0) / 0xff + 1))) {
      pcVar23 = pcVar25 + (~(ulong)psVar27 - ((ulong)(pcVar25 + ~(ulong)psVar27 + 0xf1) >> 8));
    }
    if (pcVar23 < (char *)0xf) {
LAB_0010a725:
      *(char *)psVar27 = (char)pcVar23 << 4;
      goto LAB_0010a735;
    }
    *(char *)psVar27 = -0x10;
    for (pcVar25 = pcVar23 + -0xf; psVar27 = (short *)((long)psVar27 + 1), (char *)0xfe < pcVar25;
        pcVar25 = pcVar25 + -0xff) {
      *(char *)psVar27 = -1;
    }
  }
  else {
    if (0x7e000000 < ctxBody.internal_donotuse.currentOffset) {
      return 0;
    }
    if (targetDstSize < 1) {
      return 0;
    }
    pcVar25 = dst + targetDstSize;
    ctxBody.internal_donotuse.tableType = 2;
    *(undefined4 *)((long)&ctxBody + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
    psVar8 = (short *)dst;
LAB_0010a2ad:
    uVar30 = 0x40;
    uVar9 = 1;
    lVar15 = *(long *)((long)plVar12 + 1);
    plVar11 = (long *)((long)plVar12 + 1);
    while( true ) {
      plVar22 = (long *)(uVar9 + (long)plVar11);
      psVar27 = psVar8;
      if (src + (uVar10 - 0xb) < plVar22) goto LAB_0010a644;
      uVar21 = (ulong)(lVar15 * -0x30e4432345000000) >> 0x34;
      uVar7 = *(uint *)((long)&ctxBody + uVar21 * 4);
      uVar9 = (ulong)uVar7;
      iVar14 = (int)plVar11;
      lVar15 = *plVar22;
      *(int *)((long)&ctxBody + uVar21 * 4) = iVar14 - iVar16;
      if (((uint)(iVar14 - iVar16) <= uVar7 + 0xffff) && (*(int *)(src + uVar9) == (int)*plVar11))
      break;
      uVar9 = uVar30 >> 6;
      uVar30 = (ulong)((int)uVar30 + 1);
      plVar11 = plVar22;
    }
    lVar15 = 0;
    cVar5 = (char)plVar11 * '\x10' + (char)plVar12 * -0x10;
    do {
      cVar13 = cVar5;
      lVar20 = lVar15;
      piVar31 = (int *)(src + lVar20 + uVar9);
      plVar22 = (long *)((long)plVar11 + lVar20);
      if ((piVar31 <= src) || (plVar22 <= plVar12)) break;
      lVar15 = lVar20 + -1;
      cVar5 = cVar13 + -0x10;
    } while (*(char *)((long)plVar11 + lVar20 + -1) == src[lVar20 + (uVar9 - 1)]);
    iVar18 = iVar14 - (int)plVar12;
    iVar29 = (int)lVar20;
    uVar9 = (ulong)(uint)(iVar18 + iVar29);
    uVar7 = iVar18 + iVar29;
    if ((char *)((long)psVar8 + uVar9 + (ulong)(uVar7 + 0xf0) / 0xff + 0xc) <= pcVar25) {
      if (uVar7 < 0xf) {
        psVar27 = (short *)((long)psVar8 + 1);
        *(char *)psVar8 = cVar13;
      }
      else {
        *(char *)psVar8 = -0x10;
        psVar27 = psVar8 + 1;
        for (iVar14 = (iVar14 - (int)plVar12) + iVar29 + -0xf; 0xfe < iVar14;
            iVar14 = iVar14 + -0xff) {
          *(char *)((long)psVar27 + -1) = -1;
          psVar27 = (short *)((long)psVar27 + 1);
        }
        *(char *)((long)psVar27 + -1) = (char)iVar14;
      }
      psVar24 = (short *)(uVar9 + (long)psVar27);
      lVar15 = 0;
      do {
        pcVar23 = (char *)((long)psVar27 + lVar15);
        *(undefined8 *)pcVar23 = *(undefined8 *)((long)plVar12 + lVar15);
        lVar15 = lVar15 + 8;
      } while (pcVar23 + 8 < psVar24);
      do {
        psVar27 = psVar8;
        if (pcVar25 < (char *)((long)psVar24 + 0xb)) break;
        *psVar24 = (short)plVar22 - (short)piVar31;
        puVar1 = (ulong *)((long)plVar22 + 4);
        puVar17 = (ulong *)(piVar31 + 1);
        puVar26 = puVar1;
        if (src + (uVar10 - 0xc) <= puVar1) {
LAB_0010a4e5:
          iVar14 = ((int)puVar26 - (int)plVar22) + -4;
LAB_0010a4ec:
          if (puVar26 < src + (uVar10 - 0xc)) {
            if (*puVar17 == *puVar26) goto code_r0x0010a500;
            uVar30 = *puVar26 ^ *puVar17;
            uVar9 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar7 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar14;
          }
          else {
            if ((puVar26 < src + (uVar10 - 8)) && ((int)*puVar17 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar26 < src + (uVar10 - 6)) && ((short)*puVar17 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar26 < src + (uVar10 - 5)) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar17 == (char)*puVar26));
            }
            uVar7 = (int)puVar26 - (int)puVar1;
          }
          goto LAB_0010a525;
        }
        if (*puVar17 == *puVar1) {
          puVar17 = (ulong *)(piVar31 + 3);
          puVar26 = (ulong *)((long)plVar22 + 0xc);
          goto LAB_0010a4e5;
        }
        uVar9 = *puVar1 ^ *puVar17;
        lVar15 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar7 = (uint)lVar15 >> 3;
LAB_0010a525:
        psVar27 = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + (ulong)uVar7 + 4);
        uVar6 = uVar7;
        if (pcVar25 < (char *)((long)psVar24 + (ulong)(uVar7 + 0xf0) / 0xff + 8)) {
          uVar6 = ((int)pcVar25 - (int)psVar27) * 0xff - 0x5ec;
          plVar22 = (long *)((long)plVar22 - (ulong)(uVar7 - uVar6));
          plVar12 = plVar22;
          if (plVar22 <= plVar11) {
            for (; plVar12 <= plVar11; plVar12 = (long *)((long)plVar12 + 1)) {
              *(undefined4 *)
               ((long)&ctxBody + ((ulong)(*plVar12 * -0x30e4432345000000) >> 0x34) * 4) = 0;
            }
          }
        }
        if (uVar6 < 0xf) {
          *(char *)psVar8 = (char)*psVar8 + (char)uVar6;
        }
        else {
          *(char *)psVar8 = (char)*psVar8 + '\x0f';
          psVar27[0] = -1;
          psVar27[1] = -1;
          lVar15 = 0;
          for (uVar7 = uVar6 - 0xf; 0x3fb < uVar7; uVar7 = uVar7 - 0x3fc) {
            pcVar23 = (char *)((long)psVar24 + lVar15 + 6);
            pcVar23[0] = -1;
            pcVar23[1] = -1;
            pcVar23[2] = -1;
            pcVar23[3] = -1;
            lVar15 = lVar15 + 4;
          }
          lVar20 = lVar15 + ((ulong)uVar7 & 0xffff) / 0xff;
          psVar27 = (short *)((long)psVar24 + lVar20 + 3);
          *(char *)((long)psVar24 + lVar20 + 2) =
               (char)((uVar7 & 0xffff) / 0xff) + (char)uVar6 + -0xf + (char)lVar15;
        }
        plVar12 = plVar22;
        if (src + (uVar10 - 0xb) <= plVar22) break;
        *(int *)((long)&ctxBody +
                ((ulong)(*(long *)((long)plVar22 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar22 + -2) - iVar16;
        uVar9 = (ulong)(*plVar22 * -0x30e4432345000000) >> 0x34;
        uVar6 = (int)plVar22 - iVar16;
        uVar7 = *(uint *)((long)&ctxBody + uVar9 * 4);
        piVar31 = (int *)(src + uVar7);
        *(uint *)((long)&ctxBody + uVar9 * 4) = uVar6;
        psVar8 = psVar27;
        if ((uVar7 + 0xffff < uVar6) || (*piVar31 != (int)*plVar22)) goto LAB_0010a2ad;
        psVar24 = (short *)((long)psVar27 + 1);
        *(char *)psVar27 = '\0';
      } while( true );
    }
LAB_0010a644:
    pcVar23 = src + (uVar10 - (long)plVar12);
    if (pcVar25 < (char *)((long)psVar27 + (long)(pcVar23 + (ulong)(pcVar23 + 0xf0) / 0xff + 1))) {
      pcVar23 = pcVar25 + (~(ulong)psVar27 - ((ulong)(pcVar25 + ~(ulong)psVar27 + 0xf1) >> 8));
    }
    if (pcVar23 < (char *)0xf) goto LAB_0010a725;
    *(char *)psVar27 = -0x10;
    for (pcVar25 = pcVar23 + -0xf; psVar27 = (short *)((long)psVar27 + 1), (char *)0xfe < pcVar25;
        pcVar25 = pcVar25 + -0xff) {
      *(char *)psVar27 = -1;
    }
  }
  *(char *)psVar27 = (char)pcVar25;
LAB_0010a735:
  ctxBody.internal_donotuse.dictSize = ctxBody.internal_donotuse.currentOffset;
  memcpy((char *)((long)psVar27 + 1),plVar12,(size_t)pcVar23);
  *srcSizePtr = ((int)plVar12 + (int)pcVar23) - iVar16;
  local_4078 = (int)dst;
  return ((int)(char *)((long)psVar27 + 1) + (int)pcVar23) - local_4078;
code_r0x0010a500:
  puVar26 = puVar26 + 1;
  puVar17 = puVar17 + 1;
  iVar14 = iVar14 + 8;
  goto LAB_0010a4ec;
code_r0x0010a033:
  puVar26 = puVar26 + 1;
  puVar17 = puVar17 + 1;
  iVar14 = iVar14 + 8;
  goto LAB_0010a01f;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}